

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O0

char * construct_at_path_from_parts(Dwarf_Macro_Context mc)

{
  int iVar1;
  char *pcVar2;
  Dwarf_Macro_Context mc_local;
  
  if (mc->mc_file_path == (char *)0x0) {
    if ((mc->mc_at_comp_dir == (char *)0x0) || (*mc->mc_at_comp_dir == '\0')) {
      mc_local = (Dwarf_Macro_Context)mc->mc_at_name;
    }
    else if ((mc->mc_at_name == (char *)0x0) || (*mc->mc_at_name == '\0')) {
      mc_local = (Dwarf_Macro_Context)0x0;
    }
    else {
      iVar1 = _dwarf_file_name_is_full_path((Dwarf_Small *)mc->mc_at_name);
      if (iVar1 == 0) {
        pcVar2 = construct_from_dir_and_name(mc->mc_at_comp_dir,mc->mc_at_name);
        mc->mc_file_path = pcVar2;
        mc_local = (Dwarf_Macro_Context)mc->mc_file_path;
      }
      else {
        mc_local = (Dwarf_Macro_Context)mc->mc_at_name;
      }
    }
  }
  else {
    mc_local = (Dwarf_Macro_Context)mc->mc_file_path;
  }
  return (char *)mc_local;
}

Assistant:

static const char *
construct_at_path_from_parts(Dwarf_Macro_Context mc)
{
    if (mc->mc_file_path) {
        return mc->mc_file_path;
    }
    if (!mc->mc_at_comp_dir || !mc->mc_at_comp_dir[0]) {
        return mc->mc_at_name;
    }
    if (!mc->mc_at_name || !mc->mc_at_name[0]) {
        return NULL;
    }
    if (_dwarf_file_name_is_full_path(
        (Dwarf_Small *)mc->mc_at_name)) {
        return mc->mc_at_name;
    }
    /* Dwarf_Macro_Context destructor will free this. */
    mc->mc_file_path = construct_from_dir_and_name(
        mc->mc_at_comp_dir,mc->mc_at_name);
    return mc->mc_file_path;
}